

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

Float __thiscall pbrt::XYZ::operator[](XYZ *this,int c)

{
  int c_local;
  XYZ *this_local;
  Float local_4;
  
  if (c == 0) {
    local_4 = this->X;
  }
  else if (c == 1) {
    local_4 = this->Y;
  }
  else {
    local_4 = this->Z;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float operator[](int c) const {
        DCHECK(c >= 0 && c < 3);
        if (c == 0)
            return X;
        else if (c == 1)
            return Y;
        return Z;
    }